

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O3

uo_cb * uo_cb_clone(uo_cb *cb)

{
  ulong uVar1;
  void **__src;
  size_t sVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  uo_linklist *puVar5;
  uo_linklist *puVar6;
  uo_cb *puVar7;
  void **__ptr;
  size_t sVar8;
  ulong uVar9;
  uo_linklist *puVar10;
  long in_FS_OFFSET;
  
  puVar7 = uo_cb_create();
  __src = (cb->stack).items;
  sVar2 = (cb->stack).count;
  __ptr = (puVar7->stack).items;
  sVar8 = (puVar7->stack).count;
  uVar1 = sVar8 + sVar2;
  if ((puVar7->stack).capacity < uVar1) {
    uVar9 = uVar1 - 1 >> 1 | uVar1 - 1;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    uVar9 = uVar9 >> 0x10 | uVar9;
    uVar9 = uVar9 >> 0x20 | uVar9;
    (puVar7->stack).capacity = uVar9 + 1;
    __ptr = (void **)realloc(__ptr,uVar9 * 8 + 8);
    (puVar7->stack).items = __ptr;
    sVar8 = (puVar7->stack).count;
  }
  memcpy(__ptr + sVar8,__src,sVar2 << 3);
  (puVar7->stack).count = uVar1;
  puVar10 = (cb->funclist).next;
  if (puVar10 != &cb->funclist) {
    do {
      puVar3 = puVar10[1].next;
      uo_cb_func_linkpool_grow(0x20);
      puVar4 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
      puVar5 = puVar4->next;
      puVar6 = puVar4->prev;
      puVar5->prev = puVar6;
      puVar6->next = puVar5;
      puVar4->next = (uo_linklist *)0x0;
      puVar4->prev = (uo_linklist *)0x0;
      puVar4[1].next = puVar3;
      puVar3 = (puVar7->funclist).prev;
      puVar4->prev = puVar3;
      puVar3->next = puVar4;
      puVar4->next = &puVar7->funclist;
      (puVar7->funclist).prev = puVar4;
      puVar10 = puVar10->next;
    } while (puVar10 != &cb->funclist);
  }
  return puVar7;
}

Assistant:

uo_cb *uo_cb_clone(
    const uo_cb *cb)
{
    uo_cb *cb_clone = uo_cb_create();
    uo_stack_push_arr(&cb_clone->stack, cb->stack.items, cb->stack.count);

    uo_linklist *link = cb->funclist.next;

    while (link != &cb->funclist)
    {
        uo_cb_append_func(cb_clone, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }

    return cb_clone;
}